

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths.cpp
# Opt level: O0

bool existsAsSpecified(QString *path,LocateOptions options)

{
  bool bVar1;
  byte bVar2;
  long in_FS_OFFSET;
  LocateOption in_stack_ffffffffffffff9c;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  QString *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  QDir *in_stack_ffffffffffffffe0;
  QFlagsStorageHelper<QStandardPaths::LocateOption,_4> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.super_QFlagsStorage<QStandardPaths::LocateOption>.i =
       (QFlagsStorage<QStandardPaths::LocateOption>)
       QFlags<QStandardPaths::LocateOption>::operator&
                 ((QFlags<QStandardPaths::LocateOption> *)
                  CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff9c);
  bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_10);
  if (bVar1) {
    QDir::QDir(in_stack_ffffffffffffffe0,
               (QString *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    bVar2 = QDir::exists((QDir *)0x2f172c);
    QDir::~QDir((QDir *)0x2f1746);
  }
  else {
    QFileInfo::QFileInfo
              ((QFileInfo *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    bVar2 = QFileInfo::isFile((QFileInfo *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    QFileInfo::~QFileInfo((QFileInfo *)0x2f179e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

static bool existsAsSpecified(const QString &path, QStandardPaths::LocateOptions options)
{
    if (options & QStandardPaths::LocateDirectory)
        return QDir(path).exists();
    return QFileInfo(path).isFile();
}